

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest_UsesJointWarmStart_Test::TestBody
          (TwoDimensionalQpTest_UsesJointWarmStart_Test *this)

{
  OsqpExitCode OVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  undefined8 *puVar3;
  variable_if_dynamic<long,__1> __ptr_01;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  OsqpSolver *primal_vector;
  pointer *__ptr;
  VectorXd primal_warm_start;
  AssertHelper local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [8];
  variable_if_dynamic<long,__1> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Index IStack_60;
  _Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false> local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  undefined8 local_48;
  void *local_38;
  undefined8 uStack_30;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)malloc(0x10);
  if (((ulong)paVar2 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (paVar2 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = execv;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_80 = (undefined1  [8])&local_28;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  local_78.m_value = 0;
  local_70._M_allocated_capacity = 1;
  local_70._8_8_ = (double *)0x1;
  paVar2->_M_allocated_capacity = 0x3ff0000000000000;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xbfd0000000000000
  ;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)paVar2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80,
             (Scalar *)&local_50);
  if ((local_70._8_8_ + local_78.m_value != *(Index *)((long)local_80 + 8)) ||
     (local_70._M_allocated_capacity != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  __ptr_00 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)malloc(8);
  if (__ptr_00 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = execv;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *(long *)__ptr_00 = -0x4002000000000000;
  local_70._8_8_ = (double *)0x0;
  IStack_60 = 0;
  local_80 = (undefined1  [8])
             local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
  local_78.m_value =
       local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0
      && (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  primal_vector = &(this->super_TwoDimensionalQpTest).solver_;
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_48 = 1;
  local_50._M_head_impl = __ptr_00;
  OsqpSolver::SetWarmStart
            ((OsqpSolver *)&local_58,
             (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             primal_vector,
             (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             local_80);
  local_90.data_._0_4_ =
       CONCAT31(local_90.data_._1_3_,(StatusRep *)local_58._M_head_impl == (StatusRep *)0x1);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_58._M_head_impl & 1) == 0) {
    absl::status_internal::StatusRep::Unref((StatusRep *)local_58._M_head_impl);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88;
  free(local_38);
  free((void *)local_70._8_8_);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)&local_90,
               (AssertionResult *)"solver_.SetWarmStart(primal_warm_start, dual_warm_start).ok()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x15d,(char *)local_80);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_80 != (undefined1  [8])&local_70) {
      operator_delete((void *)local_80,local_70._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    __ptr_01.m_value = (long)local_88;
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00120039;
  }
  else {
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_88);
    }
    OVar1 = OsqpSolver::Solve(primal_vector);
    local_50._M_head_impl._0_4_ = OVar1;
    local_90.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)local_80,"solver_.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_50,(OsqpExitCode *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.m_value ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_78.m_value;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0x15e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_50);
LAB_0012000b:
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_78.m_value);
      }
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OsqpSolver::iterations(primal_vector);
      local_90.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<long_long,int>
                ((internal *)local_80,"solver_.iterations()","1",(longlong *)&local_50,
                 (int *)&local_90);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.m_value ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_78.m_value;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x15f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_50);
        goto LAB_0012000b;
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00120039;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_78;
    __ptr_01.m_value = local_78.m_value;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_01.m_value);
LAB_00120039:
  free(__ptr_00);
  free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

TEST_F(TwoDimensionalQpTest, UsesJointWarmStart) {
  VectorXd primal_warm_start(2);
  primal_warm_start << 1.0, -0.25;
  VectorXd dual_warm_start(1);
  dual_warm_start << -15.0 / 8.0;
  ASSERT_TRUE(solver_.SetWarmStart(primal_warm_start, dual_warm_start).ok());
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);
  EXPECT_EQ(solver_.iterations(), 1);
}